

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_4,_4> * __thiscall
deqp::gles2::Functional::MatrixCaseUtils::matrixCompMult<float,4,4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Matrix<float,_4,_4> *a,
          Matrix<float,_4,_4> *b)

{
  int r;
  long lVar1;
  float *pfVar2;
  long lVar3;
  
  tcu::Matrix<float,_4,_4>::Matrix(__return_storage_ptr__);
  pfVar2 = (float *)__return_storage_ptr__;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
      *(float *)((long)pfVar2 + lVar3) = *(float *)(this + lVar3) * *(float *)((long)a + lVar3);
    }
    this = this + 4;
    a = (Matrix<float,_4,_4> *)((long)a + 4);
    pfVar2 = pfVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}